

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

char * lj_strfmt_wptr(char *p,void *v)

{
  uint uVar1;
  uint uVar2;
  int local_2c;
  MSize n;
  MSize i;
  ptrdiff_t x;
  void *v_local;
  char *p_local;
  char *local_8;
  
  if (v == (void *)0x0) {
    builtin_strncpy(p,"NULL",4);
    local_8 = p + 4;
  }
  else {
    if ((long)v >> 0x20 == 0) {
      local_2c = 0;
    }
    else {
      uVar1 = 0x1f;
      uVar2 = (uint)((ulong)v >> 0x20);
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      local_2c = (uVar1 >> 3) * 2 + 2;
    }
    *p = '0';
    p[1] = 'x';
    x = (ptrdiff_t)v;
    for (i = local_2c + 9; 1 < i; i = i - 1) {
      p[i] = "0123456789abcdef"[x & 0xf];
      x = x >> 4;
    }
    local_8 = p + (local_2c + 10);
  }
  return local_8;
}

Assistant:

char * LJ_FASTCALL lj_strfmt_wptr(char *p, const void *v)
{
  ptrdiff_t x = (ptrdiff_t)v;
  MSize i, n = STRFMT_MAXBUF_PTR;
  if (x == 0) {
    *p++ = 'N'; *p++ = 'U'; *p++ = 'L'; *p++ = 'L';
    return p;
  }
#if LJ_64
  /* Shorten output for 64 bit pointers. */
  n = 2+2*4+((x >> 32) ? 2+2*(lj_fls((uint32_t)(x >> 32))>>3) : 0);
#endif
  p[0] = '0';
  p[1] = 'x';
  for (i = n-1; i >= 2; i--, x >>= 4)
    p[i] = "0123456789abcdef"[(x & 15)];
  return p+n;
}